

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool container_iterator_lower_bound
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,
                uint16_t *value_out,uint16_t val)

{
  ushort uVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  array_container_t *ac;
  
  uVar2 = container_maximum(c,typecode);
  if (val <= uVar2) {
    if (typecode == '\x03') {
      iVar3 = run_container_index_equalorlarger((run_container_t *)c,val);
      it->index = iVar3;
      uVar1 = *(ushort *)(*(long *)((long)c + 8) + (long)iVar3 * 4);
      uVar4 = (uint)uVar1;
      if (uVar1 <= val) {
        uVar4 = (uint)val;
      }
    }
    else if (typecode == '\x02') {
      iVar3 = array_container_index_equalorlarger((array_container_t *)c,val);
      it->index = iVar3;
      uVar4 = (uint)*(ushort *)(*(long *)((long)c + 8) + (long)iVar3 * 2);
    }
    else {
      uVar4 = bitset_container_index_equalorlarger((bitset_container_t *)c,val);
      it->index = uVar4;
    }
    *value_out = (uint16_t)uVar4;
  }
  return val <= uVar2;
}

Assistant:

bool container_iterator_lower_bound(const container_t *c, uint8_t typecode,
                                    roaring_container_iterator_t *it,
                                    uint16_t *value_out, uint16_t val) {
    if (val > container_maximum(c, typecode)) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index = bitset_container_index_equalorlarger(bc, val);
            *value_out = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index = array_container_index_equalorlarger(ac, val);
            *value_out = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            it->index = run_container_index_equalorlarger(rc, val);
            if (rc->runs[it->index].value <= val) {
                *value_out = val;
            } else {
                *value_out = rc->runs[it->index].value;
            }
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}